

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::ConvertDateMacroString(char *str,time_t *tmt)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  time_t tVar5;
  bool bVar6;
  char buffer [12];
  tm tmt2;
  
  if ((tmt != (time_t *)0x0 && str != (char *)0x0) && (sVar3 = strlen(str), sVar3 < 0xc)) {
    strcpy(buffer,str);
    buffer[3] = '\0';
    pcVar4 = strstr(ConvertDateMacroString::month_names,buffer);
    bVar6 = pcVar4 != (char *)0x0;
    if (!bVar6) {
      return bVar6;
    }
    iVar1 = atoi(buffer + 4);
    iVar2 = atoi(buffer + 7);
    tmt2.tm_isdst = -1;
    tmt2.tm_hour = 0;
    tmt2.tm_sec = 0;
    tmt2.tm_min = 0;
    tmt2.tm_wday = 0;
    tmt2.tm_yday = 0;
    tmt2.tm_mon = (int)((long)(pcVar4 + -0x1f7880) / 3);
    tmt2.tm_year = iVar2 + -0x76c;
    tmt2.tm_mday = iVar1;
    tVar5 = mktime((tm *)&tmt2);
    *tmt = tVar5;
    return bVar6;
  }
  return false;
}

Assistant:

bool SystemTools::ConvertDateMacroString(const char *str, time_t *tmt)
{
  if (!str || !tmt || strlen(str) > 11)
    {
    return false;
    }

  struct tm tmt2;

  // __DATE__
  // The compilation date of the current source file. The date is a string
  // literal of the form Mmm dd yyyy. The month name Mmm is the same as for
  // dates generated by the library function asctime declared in TIME.H.

  // index:   012345678901
  // format:  Mmm dd yyyy
  // example: Dec 19 2003

  static char month_names[] = "JanFebMarAprMayJunJulAugSepOctNovDec";

  char buffer[12];
  strcpy(buffer, str);

  buffer[3] = 0;
  char *ptr = strstr(month_names, buffer);
  if (!ptr)
    {
    return false;
    }

  int month = static_cast<int>((ptr - month_names) / 3);
  int day = atoi(buffer + 4);
  int year = atoi(buffer + 7);

  tmt2.tm_isdst = -1;
  tmt2.tm_hour  = 0;
  tmt2.tm_min   = 0;
  tmt2.tm_sec   = 0;
  tmt2.tm_wday  = 0;
  tmt2.tm_yday  = 0;
  tmt2.tm_mday  = day;
  tmt2.tm_mon   = month;
  tmt2.tm_year  = year - 1900;

  *tmt = mktime(&tmt2);
  return true;
}